

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O0

ivec_t * find_remap(words_t *strs,ivec_t *pos,ivec_t *assoc)

{
  bool bVar1;
  reference piVar2;
  size_type sVar3;
  reference pvVar4;
  ivec_t *in_RDX;
  ivec_t *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  int i_1;
  int i;
  int h;
  iterator __end1;
  iterator __begin1;
  ivec_t *__range1;
  int N;
  ivec_t hashed;
  ivec_t *remap;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int iVar5;
  undefined4 in_stack_ffffffffffffff74;
  vector<int,_std::allocator<int>_> *this;
  int local_78;
  int local_70;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_60;
  vector<int,_std::allocator<int>_> *local_58;
  int local_50;
  vector<int,_std::allocator<int>_> local_40;
  byte local_21;
  vector<int,_std::allocator<int>_> *strs_00;
  
  local_21 = 0;
  this = in_RDI;
  strs_00 = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x10cf9b);
  do_hash((words_t *)strs_00,in_RSI,in_RDX);
  local_50 = 0;
  local_58 = &local_40;
  local_60._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff68);
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff68);
    if (!bVar1) break;
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_60);
    local_50 = int_max(local_50,*piVar2 + 1);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_60);
  }
  for (local_70 = 0; local_70 < local_50; local_70 = local_70 + 1) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (value_type_conflict1 *)in_stack_ffffffffffffff68);
  }
  local_78 = 0;
  while( true ) {
    iVar5 = local_78;
    sVar3 = std::vector<int,_std::allocator<int>_>::size(&local_40);
    if ((int)sVar3 <= iVar5) break;
    iVar5 = local_78;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,(long)local_78);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)*pvVar4);
    *pvVar4 = iVar5;
    local_78 = local_78 + 1;
  }
  local_21 = 1;
  std::vector<int,_std::allocator<int>_>::~vector(this);
  if ((local_21 & 1) == 0) {
    std::vector<int,_std::allocator<int>_>::~vector(this);
  }
  return this;
}

Assistant:

static ivec_t find_remap(words_t &strs, ivec_t &pos, ivec_t &assoc)
{
    ivec_t remap;
    auto hashed = do_hash(strs, pos, assoc);
    //for(int i=0; i<strs.size(); ++i)
    //    printf("%d) '%s'\n", hashed[i], strs[i].c_str());
    int N = 0;
    for(auto h:hashed)
        N = int_max(N,h+1);
    for(int i=0; i<N; ++i)
        remap.push_back(0);
    for(int i=0; i<(int)hashed.size(); ++i)
        remap[hashed[i]] = i;

    return remap;
}